

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O0

bool ImportKey(FileTest *t,KeyMap *key_map,_func_EVP_PKEY_ptr_CBS_ptr *parse_func,
              _func_int_CBB_ptr_EVP_PKEY_ptr *marshal_func)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  uchar *puVar4;
  size_type len_00;
  EVP_PKEY *__p;
  EVP_PKEY *pkey_00;
  char *pcVar5;
  cbb_st *pcVar6;
  pointer peVar7;
  Message *pMVar8;
  mapped_type *this;
  char *in_R9;
  byte local_63a;
  AssertHelper local_590;
  Message local_588;
  size_type local_580;
  uint local_574;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_4;
  string *key_name;
  AssertHelper local_538;
  Message local_530;
  bool local_521;
  undefined1 local_520 [8];
  AssertionResult gtest_ar__3;
  Message local_508;
  Span<const_unsigned_char> local_500;
  Bytes local_4f0;
  Span<const_unsigned_char> local_4e0;
  Bytes local_4d0;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_3;
  size_t len_3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw_1;
  string local_488;
  undefined1 local_468 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_1;
  string local_448;
  string local_428;
  AssertHelper local_408;
  Message local_400;
  bool local_3f1;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar__2;
  size_t len_2;
  string local_3d0;
  string local_3b0;
  AssertHelper local_390;
  Message local_388;
  bool local_379;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__1;
  Message local_360;
  Span<const_unsigned_char> local_358;
  Bytes local_348;
  Span<const_unsigned_char> local_338;
  Bytes local_328;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_2;
  size_t len_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw;
  string local_2e0;
  undefined1 local_2c0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  string local_2a0;
  string local_280;
  AssertHelper local_260;
  Message local_258;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_;
  size_t len;
  string local_228;
  AssertHelper local_208;
  Message local_200;
  Bytes local_1f8;
  Span<const_unsigned_char> local_1e8;
  Bytes local_1d8;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  undefined1 local_168 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  UniquePtr<uint8_t> free_der;
  size_t der_len;
  uint8_t *der;
  ScopedCBB cbb;
  Message local_100;
  int local_f8;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  string local_d8;
  undefined1 local_b8 [8];
  string key_type;
  UniquePtr<EVP_PKEY> pkey;
  CBS cbs;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  _func_int_CBB_ptr_EVP_PKEY_ptr *marshal_func_local;
  _func_EVP_PKEY_ptr_CBS_ptr *parse_func_local;
  KeyMap *key_map_local;
  FileTest *t_local;
  
  input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)marshal_func;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Input",&local_69);
  bVar2 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
                             &local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    t_local._7_1_ = 0;
    goto LAB_003769c5;
  }
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  len_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  CBS_init((CBS *)&pkey,puVar4,len_00);
  __p = (*parse_func)((CBS *)&pkey);
  std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)(key_type.field_2._M_local_buf + 8),
             __p);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(key_type.field_2._M_local_buf + 8));
  if (bVar2) {
    std::__cxx11::string::string((string *)local_b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Type",
               (allocator<char> *)
               ((long)&gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    bVar2 = FileTest::GetAttribute(t,(string *)local_b8,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_f4 = GetKeyType(t,(string *)local_b8);
      pkey_00 = (EVP_PKEY *)
                std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                          ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                           ((long)&key_type.field_2 + 8));
      local_f8 = EVP_PKEY_id(pkey_00);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_f0,"GetKeyType(t, key_type)","EVP_PKEY_id(pkey.get())",&local_f4,
                 &local_f8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar2) {
        testing::Message::Message(&local_100);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)((long)&cbb.ctx_.u + 0x18),kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                   ,0x80,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)((long)&cbb.ctx_.u + 0x18),&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&cbb.ctx_.u + 0x18));
        testing::Message::~Message(&local_100);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
                ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
      pcVar6 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
      iVar3 = CBB_init(pcVar6,0);
      puVar1 = input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (iVar3 == 0) {
LAB_00375304:
        t_local._7_1_ = 0;
      }
      else {
        pcVar6 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
        peVar7 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                            ((long)&key_type.field_2 + 8));
        iVar3 = (*(code *)puVar1)(pcVar6,peVar7);
        if (iVar3 == 0) goto LAB_00375304;
        pcVar6 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
        iVar3 = CBB_finish(pcVar6,(uint8_t **)&der_len,(size_t *)&free_der);
        if (iVar3 == 0) goto LAB_00375304;
        std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)
                   &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,(pointer)der_len);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
        std::allocator<char>::allocator();
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._6_1_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_1_ = 0;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"Output",&local_189)
        ;
        bVar2 = FileTest::HasAttribute(t,&local_188);
        local_63a = 0;
        if (bVar2) {
          std::allocator<char>::allocator();
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"Output",
                     (allocator<char> *)
                     ((long)&gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7));
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_1_ = 1;
          bVar2 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       local_168,&local_1b0);
          local_63a = bVar2 ^ 0xff;
        }
        if ((gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._5_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1b0);
        }
        if ((gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7));
        }
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator(&local_189);
        if ((local_63a & 1) == 0) {
          bssl::Span<unsigned_char_const>::
          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<unsigned_char_const> *)&local_1e8,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
          Bytes::Bytes(&local_1d8,local_1e8);
          Bytes::Bytes(&local_1f8,(uint8_t *)der_len,
                       (size_t)free_der._M_t.
                               super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
          testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                    ((EqHelper *)local_1c8,"Bytes(output)","Bytes(der, der_len)",&local_1d8,
                     &local_1f8);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
          if (!bVar2) {
            testing::Message::Message(&local_200);
            pMVar8 = testing::Message::operator<<
                               (&local_200,(char (*) [35])"Re-encoding the key did not match.");
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_208,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0x92,pcVar5);
            testing::internal::AssertHelper::operator=(&local_208,pMVar8);
            testing::internal::AssertHelper::~AssertHelper(&local_208);
            testing::Message::~Message(&local_200);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,"ExpectNoRawPrivate",(allocator<char> *)((long)&len + 7));
          bVar2 = FileTest::HasAttribute(t,&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          std::allocator<char>::~allocator((allocator<char> *)((long)&len + 7));
          if (bVar2) {
            peVar7 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                ((long)&key_type.field_2 + 8));
            iVar3 = EVP_PKEY_get_raw_private_key
                              (peVar7,(uint8_t *)0x0,(size_t *)&gtest_ar_.message_);
            local_249 = iVar3 == 0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_248,&local_249,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
            if (!bVar2) {
              testing::Message::Message(&local_258);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_280,(internal *)local_248,
                         (AssertionResult *)
                         "EVP_PKEY_get_raw_private_key(pkey.get(), nullptr, &len)","true","false",
                         in_R9);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_260,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                         ,0x97,pcVar5);
              testing::internal::AssertHelper::operator=(&local_260,&local_258);
              testing::internal::AssertHelper::~AssertHelper(&local_260);
              std::__cxx11::string::~string((string *)&local_280);
              testing::Message::~Message(&local_258);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2a0,"ExpectRawPrivate",
                       (allocator<char> *)
                       ((long)&expected.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            bVar2 = FileTest::HasAttribute(t,&local_2a0);
            std::__cxx11::string::~string((string *)&local_2a0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&expected.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            if (bVar2) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2c0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2e0,"ExpectRawPrivate",
                         (allocator<char> *)
                         ((long)&raw.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              bVar2 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_2c0,&local_2e0);
              std::__cxx11::string::~string((string *)&local_2e0);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&raw.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len_1);
                peVar7 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                    ((long)&key_type.field_2 + 8));
                iVar3 = EVP_PKEY_get_raw_private_key
                                  (peVar7,(uint8_t *)0x0,(size_t *)&gtest_ar_2.message_);
                if (iVar3 == 0) {
                  t_local._7_1_ = 0;
                  bVar2 = true;
                }
                else {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len_1,
                             (size_type)
                             gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
                  peVar7 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                      ((long)&key_type.field_2 + 8));
                  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &len_1);
                  iVar3 = EVP_PKEY_get_raw_private_key(peVar7,puVar4,(size_t *)&gtest_ar_2.message_)
                  ;
                  if (iVar3 == 0) {
                    t_local._7_1_ = 0;
                    bVar2 = true;
                  }
                  else {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len_1,
                               (size_type)
                               gtest_ar_2.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
                    bssl::Span<unsigned_char_const>::
                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ((Span<unsigned_char_const> *)&local_338,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len_1);
                    Bytes::Bytes(&local_328,local_338);
                    bssl::Span<unsigned_char_const>::
                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ((Span<unsigned_char_const> *)&local_358,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2c0);
                    Bytes::Bytes(&local_348,local_358);
                    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                              ((EqHelper *)local_318,"Bytes(raw)","Bytes(expected)",&local_328,
                               &local_348);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_318);
                    if (!bVar2) {
                      testing::Message::Message(&local_360);
                      pcVar5 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_318);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                 ,0xa8,pcVar5);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar__1.message_,&local_360);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar__1.message_);
                      testing::Message::~Message(&local_360);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len_1,
                               (long)gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl - 1);
                    gtest_ar_2.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &len_1);
                    peVar7 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                        ((long)&key_type.field_2 + 8));
                    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        &len_1);
                    iVar3 = EVP_PKEY_get_raw_private_key
                                      (peVar7,puVar4,(size_t *)&gtest_ar_2.message_);
                    local_379 = iVar3 == 0;
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_378,&local_379,(type *)0x0);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_378);
                    if (!bVar2) {
                      testing::Message::Message(&local_388);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_3b0,(internal *)local_378,
                                 (AssertionResult *)
                                 "EVP_PKEY_get_raw_private_key(pkey.get(), raw.data(), &len)","true"
                                 ,"false",in_R9);
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_390,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                 ,0xad,pcVar5);
                      testing::internal::AssertHelper::operator=(&local_390,&local_388);
                      testing::internal::AssertHelper::~AssertHelper(&local_390);
                      std::__cxx11::string::~string((string *)&local_3b0);
                      testing::Message::~Message(&local_388);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
                    bVar2 = false;
                  }
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len_1);
              }
              else {
                t_local._7_1_ = 0;
                bVar2 = true;
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2c0);
              if (bVar2) goto LAB_00376941;
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d0,"ExpectNoRawPublic",(allocator<char> *)((long)&len_2 + 7))
          ;
          bVar2 = FileTest::HasAttribute(t,&local_3d0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&len_2 + 7));
          if (bVar2) {
            peVar7 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                ((long)&key_type.field_2 + 8));
            iVar3 = EVP_PKEY_get_raw_public_key
                              (peVar7,(uint8_t *)0x0,(size_t *)&gtest_ar__2.message_);
            local_3f1 = iVar3 == 0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_3f0,&local_3f1,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
            if (!bVar2) {
              testing::Message::Message(&local_400);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_428,(internal *)local_3f0,
                         (AssertionResult *)"EVP_PKEY_get_raw_public_key(pkey.get(), nullptr, &len)"
                         ,"true","false",in_R9);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_408,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                         ,0xb2,pcVar5);
              testing::internal::AssertHelper::operator=(&local_408,&local_400);
              testing::internal::AssertHelper::~AssertHelper(&local_408);
              std::__cxx11::string::~string((string *)&local_428);
              testing::Message::~Message(&local_400);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_448,"ExpectRawPublic",
                       (allocator<char> *)
                       ((long)&expected_1.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            bVar2 = FileTest::HasAttribute(t,&local_448);
            std::__cxx11::string::~string((string *)&local_448);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&expected_1.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            if (bVar2) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_468);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_488,"ExpectRawPublic",
                         (allocator<char> *)
                         ((long)&raw_1.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              bVar2 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_468,&local_488);
              std::__cxx11::string::~string((string *)&local_488);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&raw_1.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len_3);
                peVar7 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                    ((long)&key_type.field_2 + 8));
                iVar3 = EVP_PKEY_get_raw_public_key
                                  (peVar7,(uint8_t *)0x0,(size_t *)&gtest_ar_3.message_);
                if (iVar3 == 0) {
                  t_local._7_1_ = 0;
                  bVar2 = true;
                }
                else {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len_3,
                             (size_type)
                             gtest_ar_3.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
                  peVar7 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                      ((long)&key_type.field_2 + 8));
                  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &len_3);
                  iVar3 = EVP_PKEY_get_raw_public_key(peVar7,puVar4,(size_t *)&gtest_ar_3.message_);
                  if (iVar3 == 0) {
                    t_local._7_1_ = 0;
                    bVar2 = true;
                  }
                  else {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len_3,
                               (size_type)
                               gtest_ar_3.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
                    bssl::Span<unsigned_char_const>::
                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ((Span<unsigned_char_const> *)&local_4e0,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len_3);
                    Bytes::Bytes(&local_4d0,local_4e0);
                    bssl::Span<unsigned_char_const>::
                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ((Span<unsigned_char_const> *)&local_500,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_468);
                    Bytes::Bytes(&local_4f0,local_500);
                    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                              ((EqHelper *)local_4c0,"Bytes(raw)","Bytes(expected)",&local_4d0,
                               &local_4f0);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4c0);
                    if (!bVar2) {
                      testing::Message::Message(&local_508);
                      pcVar5 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_4c0);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                 ,0xc3,pcVar5);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar__3.message_,&local_508);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar__3.message_);
                      testing::Message::~Message(&local_508);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len_3,
                               (long)gtest_ar_3.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl - 1);
                    gtest_ar_3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &len_3);
                    peVar7 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                        ((long)&key_type.field_2 + 8));
                    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        &len_3);
                    iVar3 = EVP_PKEY_get_raw_public_key
                                      (peVar7,puVar4,(size_t *)&gtest_ar_3.message_);
                    local_521 = iVar3 == 0;
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_520,&local_521,(type *)0x0);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_520);
                    if (!bVar2) {
                      testing::Message::Message(&local_530);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&key_name,(internal *)local_520,
                                 (AssertionResult *)
                                 "EVP_PKEY_get_raw_public_key(pkey.get(), raw.data(), &len)","true",
                                 "false",in_R9);
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_538,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                 ,200,pcVar5);
                      testing::internal::AssertHelper::operator=(&local_538,&local_530);
                      testing::internal::AssertHelper::~AssertHelper(&local_538);
                      std::__cxx11::string::~string((string *)&key_name);
                      testing::Message::~Message(&local_530);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
                    bVar2 = false;
                  }
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len_3);
              }
              else {
                t_local._7_1_ = 0;
                bVar2 = true;
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_468);
              if (bVar2) goto LAB_00376941;
            }
          }
          gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )FileTest::GetParameter_abi_cxx11_(t);
          local_574 = 0;
          local_580 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
                      ::count(key_map,(key_type *)
                                      gtest_ar_4.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                    ((EqHelper *)local_570,"0u","key_map->count(key_name)",&local_574,&local_580);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
          if (!bVar2) {
            testing::Message::Message(&local_588);
            pMVar8 = testing::Message::operator<<(&local_588,(char (*) [16])"Duplicate key: ");
            pMVar8 = testing::Message::operator<<
                               (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)gtest_ar_4.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
            testing::internal::AssertHelper::AssertHelper
                      (&local_590,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0xcd,pcVar5);
            testing::internal::AssertHelper::operator=(&local_590,pMVar8);
            testing::internal::AssertHelper::~AssertHelper(&local_590);
            testing::Message::~Message(&local_588);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
          this = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
                 ::operator[](key_map,(key_type *)
                                      gtest_ar_4.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator=
                    (this,(unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                          ((long)&key_type.field_2 + 8));
          t_local._7_1_ = 1;
        }
        else {
          t_local._7_1_ = 0;
        }
LAB_00376941:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)
                   &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
      }
      bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
    }
    else {
      t_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_b8);
  }
  else {
    t_local._7_1_ = 0;
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)((long)&key_type.field_2 + 8));
LAB_003769c5:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return (bool)(t_local._7_1_ & 1);
}

Assistant:

static bool ImportKey(FileTest *t, KeyMap *key_map,
                      EVP_PKEY *(*parse_func)(CBS *cbs),
                      int (*marshal_func)(CBB *cbb, const EVP_PKEY *key)) {
  std::vector<uint8_t> input;
  if (!t->GetBytes(&input, "Input")) {
    return false;
  }

  CBS cbs;
  CBS_init(&cbs, input.data(), input.size());
  bssl::UniquePtr<EVP_PKEY> pkey(parse_func(&cbs));
  if (!pkey) {
    return false;
  }

  std::string key_type;
  if (!t->GetAttribute(&key_type, "Type")) {
    return false;
  }
  EXPECT_EQ(GetKeyType(t, key_type), EVP_PKEY_id(pkey.get()));

  // The key must re-encode correctly.
  bssl::ScopedCBB cbb;
  uint8_t *der;
  size_t der_len;
  if (!CBB_init(cbb.get(), 0) ||
      !marshal_func(cbb.get(), pkey.get()) ||
      !CBB_finish(cbb.get(), &der, &der_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_der(der);

  std::vector<uint8_t> output = input;
  if (t->HasAttribute("Output") &&
      !t->GetBytes(&output, "Output")) {
    return false;
  }
  EXPECT_EQ(Bytes(output), Bytes(der, der_len))
      << "Re-encoding the key did not match.";

  if (t->HasAttribute("ExpectNoRawPrivate")) {
    size_t len;
    EXPECT_FALSE(EVP_PKEY_get_raw_private_key(pkey.get(), nullptr, &len));
  } else if (t->HasAttribute("ExpectRawPrivate")) {
    std::vector<uint8_t> expected;
    if (!t->GetBytes(&expected, "ExpectRawPrivate")) {
      return false;
    }

    std::vector<uint8_t> raw;
    size_t len;
    if (!EVP_PKEY_get_raw_private_key(pkey.get(), nullptr, &len)) {
      return false;
    }
    raw.resize(len);
    if (!EVP_PKEY_get_raw_private_key(pkey.get(), raw.data(), &len)) {
      return false;
    }
    raw.resize(len);
    EXPECT_EQ(Bytes(raw), Bytes(expected));

    // Short buffers should be rejected.
    raw.resize(len - 1);
    len = raw.size();
    EXPECT_FALSE(EVP_PKEY_get_raw_private_key(pkey.get(), raw.data(), &len));
  }

  if (t->HasAttribute("ExpectNoRawPublic")) {
    size_t len;
    EXPECT_FALSE(EVP_PKEY_get_raw_public_key(pkey.get(), nullptr, &len));
  } else if (t->HasAttribute("ExpectRawPublic")) {
    std::vector<uint8_t> expected;
    if (!t->GetBytes(&expected, "ExpectRawPublic")) {
      return false;
    }

    std::vector<uint8_t> raw;
    size_t len;
    if (!EVP_PKEY_get_raw_public_key(pkey.get(), nullptr, &len)) {
      return false;
    }
    raw.resize(len);
    if (!EVP_PKEY_get_raw_public_key(pkey.get(), raw.data(), &len)) {
      return false;
    }
    raw.resize(len);
    EXPECT_EQ(Bytes(raw), Bytes(expected));

    // Short buffers should be rejected.
    raw.resize(len - 1);
    len = raw.size();
    EXPECT_FALSE(EVP_PKEY_get_raw_public_key(pkey.get(), raw.data(), &len));
  }

  // Save the key for future tests.
  const std::string &key_name = t->GetParameter();
  EXPECT_EQ(0u, key_map->count(key_name)) << "Duplicate key: " << key_name;
  (*key_map)[key_name] = std::move(pkey);
  return true;
}